

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_lib.c
# Opt level: O0

int mk_config_set(mk_ctx_t *ctx,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined8 *local_128;
  undefined8 *local_110;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  uint local_48;
  undefined4 local_44;
  va_list va;
  char *value;
  char *key;
  int ret;
  mk_ctx_t *ctx_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_f8;
  va[0]._0_8_ = &stack0x00000008;
  local_44 = 0x30;
  local_48 = 8;
  local_f0 = in_RSI;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  while( true ) {
    if (local_48 < 0x29) {
      local_110 = (undefined8 *)((long)(int)local_48 + (long)va[0].overflow_arg_area);
      local_48 = local_48 + 8;
    }
    else {
      local_110 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    if ((char *)*local_110 == (char *)0x0) {
      return 0;
    }
    if (local_48 < 0x29) {
      local_128 = (undefined8 *)((long)(int)local_48 + (long)va[0].overflow_arg_area);
      local_48 = local_48 + 8;
    }
    else {
      local_128 = (undefined8 *)va[0]._0_8_;
      va[0]._0_8_ = va[0]._0_8_ + 8;
    }
    va[0].reg_save_area = (void *)*local_128;
    if ((char *)va[0].reg_save_area == (char *)0x0) break;
    iVar1 = mk_config_set_property(ctx->server,(char *)*local_110,(char *)va[0].reg_save_area);
    if (iVar1 != 0) {
      return -1;
    }
  }
  return -1;
}

Assistant:

int mk_config_set(mk_ctx_t *ctx, ...)
{
    int ret;
    char *key;
    char *value;
    va_list va;

    va_start(va, ctx);

    while ((key = va_arg(va, char *))) {
        value = va_arg(va, char *);
        if (!value) {
            /* Wrong parameter */
            va_end(va);
            return -1;
        }

        ret = mk_config_set_property(ctx->server, key, value);
        if (ret != 0) {
            va_end(va);
            return -1;
        }
    }

    va_end(va);
    return 0;
}